

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O2

int Abc_NtkSubDagSize_rec(Abc_Obj_t *pObj,Vec_Int_t *vAttrs)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int Fill;
  long in_RDX;
  int iVar4;
  Vec_Int_t *pVVar5;
  
  iVar4 = 0;
  while( true ) {
    pVVar5 = &pObj->pNtk->vTravIds;
    iVar2 = pObj->Id;
    Vec_IntFillExtra(pVVar5,iVar2 + 1,(int)in_RDX);
    iVar1 = Vec_IntEntry(pVVar5,iVar2);
    iVar2 = pObj->pNtk->nTravIds;
    if (iVar1 == iVar2) break;
    pVVar5 = &pObj->pNtk->vTravIds;
    iVar1 = pObj->Id;
    Vec_IntFillExtra(pVVar5,iVar1 + 1,Fill);
    Vec_IntWriteEntry(pVVar5,iVar1,iVar2);
    iVar2 = Vec_IntEntry(vAttrs,pObj->Id);
    if (iVar2 != 0) break;
    uVar3 = *(uint *)&pObj->field_0x14 & 0xf;
    if ((uVar3 == 2) || (uVar3 == 5)) {
      iVar2 = 1;
      goto LAB_0026c5c6;
    }
    if ((pObj->vFanins).nSize != 2) {
      __assert_fail("Abc_ObjFaninNum(pObj) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCut.c"
                    ,0x291,"int Abc_NtkSubDagSize_rec(Abc_Obj_t *, Vec_Int_t *)");
    }
    iVar2 = Abc_NtkSubDagSize_rec
                      ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],vAttrs);
    in_RDX = (long)(pObj->vFanins).pArray[1];
    pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[in_RDX];
    iVar4 = iVar4 + iVar2 + 1;
  }
  iVar2 = 0;
LAB_0026c5c6:
  return iVar2 + iVar4;
}

Assistant:

int Abc_NtkSubDagSize_rec( Abc_Obj_t * pObj, Vec_Int_t * vAttrs ) 
{
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return 0;
    Abc_NodeSetTravIdCurrent(pObj);
    if ( Vec_IntEntry( vAttrs, pObj->Id ) )
        return 0;
    if ( Abc_ObjIsCi(pObj) )
        return 1;
    assert( Abc_ObjFaninNum(pObj) == 2 );
    return 1 + Abc_NtkSubDagSize_rec(Abc_ObjFanin0(pObj), vAttrs) +
        Abc_NtkSubDagSize_rec(Abc_ObjFanin1(pObj), vAttrs);
}